

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IMC_Generator.cpp
# Opt level: O2

String * __thiscall
nigel::IMC_Generator::operatorToString_abi_cxx11_
          (String *__return_storage_ptr__,IMC_Generator *this,shared_ptr<nigel::IM_Operator> *op)

{
  char cVar1;
  string *psVar2;
  bool bVar3;
  char *pcVar4;
  string local_70;
  undefined1 local_50 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  _func_int **local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  switch(((op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type) {
  case constant:
    IM_Operator::as<nigel::IM_Constant>((IM_Operator *)local_50);
    helper::int_to_hex<unsigned_char>(&local_70,*(u8 *)(local_50._0_8_ + 0x1c));
    std::operator+(__return_storage_ptr__,"#",&local_70);
    goto LAB_0015f2a1;
  case variable:
    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_50);
    std::__cxx11::to_string(&local_70,*(uint *)(local_50._0_8_ + 0x20));
    std::operator+(__return_storage_ptr__,"v",&local_70);
LAB_0015f2a1:
    std::__cxx11::string::~string((string *)&local_70);
    break;
  case sfr:
    IM_Operator::as<nigel::IM_SFR>((IM_Operator *)&local_70);
    cVar1 = local_70._M_dataplus._M_p[0x1c];
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_70._M_string_length);
    if (cVar1 == -0x20) {
      pcVar4 = "A";
    }
    else {
      IM_Operator::as<nigel::IM_SFR>((IM_Operator *)&local_70);
      cVar1 = local_70._M_dataplus._M_p[0x1c];
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_70._M_string_length);
      if (cVar1 == -0x10) {
        pcVar4 = "B";
      }
      else {
        IM_Operator::as<nigel::IM_SFR>((IM_Operator *)&local_70);
        cVar1 = local_70._M_dataplus._M_p[0x1c];
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_70._M_string_length);
        if (cVar1 == -0x7f) {
          pcVar4 = "SP";
        }
        else {
          IM_Operator::as<nigel::IM_SFR>((IM_Operator *)&local_70);
          cVar1 = local_70._M_dataplus._M_p[0x1c];
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_70._M_string_length);
          if (cVar1 == '\a') {
            pcVar4 = "BR";
          }
          else {
            IM_Operator::as<nigel::IM_SFR>((IM_Operator *)&local_70);
            cVar1 = local_70._M_dataplus._M_p[0x1c];
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_70._M_string_length);
            if (cVar1 == '\x06') {
              pcVar4 = "SW";
            }
            else {
              pcVar4 = "-!-UNKNOWN_SFR-!-";
            }
          }
        }
      }
    }
    goto LAB_0015f435;
  case block:
    IM_Operator::as<nigel::IM_Block>((IM_Operator *)&local_70);
    bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_70._M_dataplus._M_p + 0x20),"");
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_70._M_string_length);
    if (bVar3) {
      IM_Operator::as<nigel::IM_Block>((IM_Operator *)&local_70);
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,(string *)(local_70._M_dataplus._M_p + 0x20));
      psVar2 = &local_70;
      goto LAB_0015f2b0;
    }
    IM_Operator::as<nigel::IM_Block>((IM_Operator *)local_50);
    cVar1 = *(char *)(local_50._0_8_ + 0x40);
    if (cVar1 == '\0') {
      IM_Operator::as<nigel::IM_Block>((IM_Operator *)(local_50 + 0x10));
      pcVar4 = "end";
      if (*(char *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_50._16_8_ + 0x40)
                           )->_vptr__Sp_counted_base + 1) != '\0') {
        pcVar4 = "finish";
      }
    }
    else {
      pcVar4 = "begin";
    }
    IM_Operator::as<nigel::IM_Block>((IM_Operator *)&local_30);
    std::__cxx11::to_string(&local_70,*(uint *)((long)local_30 + 0x1c));
    std::operator+(__return_storage_ptr__,pcVar4,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
    if (cVar1 == '\0') goto LAB_0015f1d2;
    break;
  case condition:
    IM_Operator::as<nigel::IM_Condition>((IM_Operator *)local_50);
    pcVar4 = "false";
    if (*(char *)(local_50._0_8_ + 0x20) != '\0') {
      pcVar4 = "true";
    }
    IM_Operator::as<nigel::IM_Condition>((IM_Operator *)(local_50 + 0x10));
    std::__cxx11::to_string
              (&local_70,
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_50._16_8_ + 0x10))->
               _M_weak_count);
    std::operator+(__return_storage_ptr__,pcVar4,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
LAB_0015f1d2:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    break;
  default:
    pcVar4 = "-!-UNKNOWN-!-";
LAB_0015f435:
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar4,(allocator *)&local_70);
    return __return_storage_ptr__;
  }
  psVar2 = (string *)local_50;
LAB_0015f2b0:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&psVar2->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

String IMC_Generator::operatorToString( std::shared_ptr<IM_Operator> op )
	{
		if( op->type == IM_Operator::Type::constant ) return "#" + int_to_hex( op->as<IM_Constant>()->data );
		else if( op->type == IM_Operator::Type::variable ) return "v" + to_string( op->as<IM_Variable>()->id );
		else if( op->type == IM_Operator::Type::sfr )
		{
			if( op->as<IM_SFR>()->address == static_cast< u8 >( IM_SFR::SFR::A ) ) return "A";
			else if( op->as<IM_SFR>()->address == static_cast< u8 >( IM_SFR::SFR::B ) ) return "B";
			else if( op->as<IM_SFR>()->address == static_cast< u8 >( IM_SFR::SFR::SP ) ) return "SP";
			else if( op->as<IM_SFR>()->address == static_cast< u8 >( IM_SFR::SFR::BR ) ) return "BR";
			else if( op->as<IM_SFR>()->address == static_cast< u8 >( IM_SFR::SFR::SW ) ) return "SW";
			else return "-!-UNKNOWN_SFR-!-";
		}
		else if( op->type == IM_Operator::Type::block )
		{
			if( op->as<IM_Block>()->symbol != "" ) return op->as<IM_Block>()->symbol;
			else return ( op->as<IM_Block>()->begin ? "begin" : op->as<IM_Block>()->finish ? "finish" : "end" ) + to_string( op->as<IM_Block>()->blockID );
		}
		else if( op->type == IM_Operator::Type::condition )
			return ( op->as<IM_Condition>()->isTrue ? "true" : "false" ) + to_string( op->as<IM_Condition>()->conditionID );
		else return "-!-UNKNOWN-!-";
	}